

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  string *psVar1;
  OfType OVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  pointer pMVar7;
  Colour colourGuard_3;
  Colour colourGuard;
  Colour colourGuard_1;
  ConsoleAssertionPrinter printer;
  
  iVar4 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  printer.printInfoMessages = true;
  if (((char)iVar4 == '\0') &&
     (((OVar2 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar2 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (printer.printInfoMessages = false, OVar2 != Warning)))) {
    return false;
  }
  lazyPrint(this);
  printer.stream = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  psVar1 = &printer.passOrFail;
  printer.colour = None;
  printer.passOrFail._M_dataplus._M_p = (pointer)&printer.passOrFail.field_2;
  printer.passOrFail._M_string_length = 0;
  printer.passOrFail.field_2._M_local_buf[0] = '\0';
  printer.messageLabel._M_dataplus._M_p = (pointer)&printer.messageLabel.field_2;
  printer.messageLabel._M_string_length = 0;
  printer.messageLabel.field_2._M_local_buf[0] = '\0';
  printer.stats = _assertionStats;
  printer.result = &_assertionStats->assertionResult;
  std::__cxx11::string::string
            ((string *)&printer.message,(string *)&(_assertionStats->assertionResult).m_resultData);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&printer.messages,&_assertionStats->infoMessages);
  OVar2 = ((printer.result)->m_resultData).resultType;
  switch(OVar2) {
  case Ok:
    printer.colour = Green;
    std::__cxx11::string::assign((char *)psVar1);
    lVar5 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar5 == 0x48) {
      std::__cxx11::string::assign((char *)&printer.messageLabel);
LAB_0018c646:
      lVar5 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
joined_r0x0018c4d8:
    if ((ulong)(lVar5 / 0x48) < 2) goto LAB_0018c673;
    break;
  case Info:
    break;
  case Warning:
    break;
  case Unknown:
    goto switchD_0018c464_caseD_0;
  default:
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        printer.colour = Green;
        if ((((printer.result)->m_info).resultDisposition & SuppressFail) == 0) {
          printer.colour = BrightRed;
        }
        std::__cxx11::string::assign((char *)psVar1);
        lVar5 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar5 == 0x48) {
          std::__cxx11::string::assign((char *)&printer.messageLabel);
          goto LAB_0018c646;
        }
      }
      else {
        if (OVar2 != ExplicitFailure) {
          if (OVar2 != Exception) {
            if (OVar2 == ThrewException) {
              printer.colour = BrightRed;
              std::__cxx11::string::assign((char *)psVar1);
              std::__cxx11::string::assign((char *)&printer.messageLabel);
              lVar5 = (long)(_assertionStats->infoMessages).
                            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(_assertionStats->infoMessages).
                            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              if (lVar5 == 0x48) {
                std::__cxx11::string::append((char *)&printer.messageLabel);
                lVar5 = (long)(_assertionStats->infoMessages).
                              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(_assertionStats->infoMessages).
                              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start;
              }
              if (1 < (ulong)(lVar5 / 0x48)) {
                std::__cxx11::string::append((char *)&printer.messageLabel);
              }
              goto LAB_0018c673;
            }
            if (OVar2 == DidntThrowException) {
              printer.colour = BrightRed;
              std::__cxx11::string::assign((char *)psVar1);
            }
            else {
              if (OVar2 != FatalErrorCondition) goto LAB_0018c673;
              printer.colour = BrightRed;
              std::__cxx11::string::assign((char *)psVar1);
            }
            break;
          }
          goto switchD_0018c464_caseD_0;
        }
        std::__cxx11::string::assign((char *)psVar1);
        printer.colour = BrightRed;
        lVar5 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar5 == 0x48) {
          std::__cxx11::string::assign((char *)&printer.messageLabel);
          lVar5 = (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        }
      }
      goto joined_r0x0018c4d8;
    }
    goto switchD_0018c464_caseD_0;
  }
  std::__cxx11::string::assign((char *)&printer.messageLabel);
LAB_0018c673:
  colourGuard.m_moved = false;
  Colour::use(FileName);
  poVar6 = printer.stream;
  _colourGuard_1 = ((printer.result)->m_info).lineInfo.file;
  Catch::operator<<(printer.stream,(SourceLineInfo *)&colourGuard_1);
  std::operator<<(poVar6,": ");
  Colour::~Colour(&colourGuard);
  if (((printer.stats)->totals).assertions.failed + ((printer.stats)->totals).assertions.passed +
      ((printer.stats)->totals).assertions.failedButOk == 0) {
    std::operator<<(printer.stream,'\n');
  }
  else {
    if (printer.passOrFail._M_string_length != 0) {
      _colourGuard_1 = _colourGuard_1 & 0xffffffffffffff00;
      Colour::use(printer.colour);
      poVar6 = std::operator<<(printer.stream,(string *)psVar1);
      std::operator<<(poVar6,":\n");
      Colour::~Colour(&colourGuard_1);
    }
    if (((printer.result)->m_info).capturedExpression.m_size != 0) {
      colourGuard.m_moved = false;
      Colour::use(Cyan);
      std::operator<<(printer.stream,"  ");
      poVar6 = printer.stream;
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)&colourGuard_1,printer.result);
      std::operator<<(poVar6,(string *)&colourGuard_1);
      std::__cxx11::string::~string((string *)&colourGuard_1);
      std::operator<<(printer.stream,'\n');
      Colour::~Colour(&colourGuard);
    }
    bVar3 = AssertionResult::hasExpandedExpression(printer.result);
    if (bVar3) {
      std::operator<<(printer.stream,"with expansion:\n");
      colourGuard_3.m_moved = false;
      Colour::use(BrightYellow);
      poVar6 = printer.stream;
      AssertionResult::getExpandedExpression_abi_cxx11_((string *)&colourGuard,printer.result);
      clara::TextFlow::Column::Column((Column *)&colourGuard_1,(string *)&colourGuard);
      poVar6 = clara::TextFlow::operator<<(poVar6,(Column *)&colourGuard_1);
      std::operator<<(poVar6,'\n');
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&colourGuard_1);
      std::__cxx11::string::~string((string *)&colourGuard);
      Colour::~Colour(&colourGuard_3);
    }
  }
  if (printer.messageLabel._M_string_length != 0) {
    poVar6 = std::operator<<(printer.stream,(string *)&printer.messageLabel);
    poVar6 = std::operator<<(poVar6,':');
    std::operator<<(poVar6,'\n');
  }
  for (pMVar7 = printer.messages.
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; poVar6 = printer.stream,
      pMVar7 != printer.messages.
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_finish; pMVar7 = pMVar7 + 1) {
    if ((printer.printInfoMessages != false) || (pMVar7->type != Info)) {
      clara::TextFlow::Column::Column((Column *)&colourGuard_1,&pMVar7->message);
      poVar6 = clara::TextFlow::operator<<(poVar6,(Column *)&colourGuard_1);
      std::operator<<(poVar6,'\n');
      clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&colourGuard_1);
    }
  }
  std::endl<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream);
  anon_unknown_1::ConsoleAssertionPrinter::~ConsoleAssertionPrinter(&printer);
  return true;
switchD_0018c464_caseD_0:
  std::__cxx11::string::assign((char *)psVar1);
  printer.colour = BrightRed;
  goto LAB_0018c673;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const& _assertionStats) {
    AssertionResult const& result = _assertionStats.assertionResult;

    bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

    // Drop out if result was successful but we're not printing them.
    if (!includeResults && result.getResultType() != ResultWas::Warning)
        return false;

    lazyPrint();

    ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
    printer.print();
    stream << std::endl;
    return true;
}